

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mcode.c
# Opt level: O0

MCode * lj_mcode_reserve(jit_State *J,MCode **lim)

{
  undefined8 uVar1;
  jit_State *in_RSI;
  long in_RDI;
  int in_stack_ffffffffffffffec;
  
  if (*(long *)(in_RDI + 0x9c8) == 0) {
    mcode_allocarea(in_RSI);
  }
  else {
    mcode_protect(in_RSI,in_stack_ffffffffffffffec);
  }
  uVar1 = *(undefined8 *)(in_RDI + 0x9d8);
  (in_RSI->cur).nextgc = (GCRef)(int)uVar1;
  (in_RSI->cur).marked = (char)((ulong)uVar1 >> 0x20);
  (in_RSI->cur).gct = (char)((ulong)uVar1 >> 0x28);
  (in_RSI->cur).nsnap = (short)((ulong)uVar1 >> 0x30);
  return *(MCode **)(in_RDI + 0x9d0);
}

Assistant:

MCode *lj_mcode_reserve(jit_State *J, MCode **lim)
{
  if (!J->mcarea)
    mcode_allocarea(J);
  else
    mcode_protect(J, MCPROT_GEN);
  *lim = J->mcbot;
  return J->mctop;
}